

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O2

int loop(sockaddr_in *address)

{
  string *__lhs;
  bool bVar1;
  uint __i;
  int iVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  time_t tVar6;
  ostream *poVar7;
  pointer pSVar8;
  socklen_t in_ECX;
  iterator __begin1_1;
  size_t __nbytes;
  sockaddr *__addr;
  int iVar9;
  int iVar10;
  char *pcVar11;
  Segment *segment;
  pointer pSVar12;
  Type urn;
  double dVar13;
  double dVar14;
  double local_2d8;
  allocator<char> local_2c9;
  string payload;
  string mediaSession;
  string state;
  string videoID;
  string customState;
  string type;
  Connection connection;
  string msgLengthBuffer;
  string response;
  CastMessage message;
  timeval timeout;
  string local_d0;
  fd_set fdset;
  
  std::__cxx11::string::assign(cc::dest_abi_cxx11_);
  if (s_verbose == true) {
    puts("Opening connection");
  }
  Connection::Connection(&connection);
  iVar2 = Connection::connect(&connection,(int)address,__addr,in_ECX);
  if ((char)iVar2 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to connect to ");
    pcVar11 = inet_ntoa((in_addr)(address->sin_addr).s_addr);
    poVar7 = std::operator<<(poVar7,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    if (s_verbose == true) {
      puts("Sending connection message");
    }
    bVar1 = cc::sendSimple(&connection,Connect,Connection);
    if (bVar1) {
      puts("Connected");
      bVar1 = cc::sendSimple(&connection,GetStatus,Receiver);
      if (bVar1) {
        s_lastPing = time((time_t *)0x0);
LAB_001078f3:
        do {
          if ((s_running != '\0') || ((connection.eof & 1U) != 0)) goto LAB_001089ff;
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            fdset.fds_bits[lVar4] = 0;
          }
          fdset.fds_bits[connection.fd / 0x40] =
               fdset.fds_bits[connection.fd / 0x40] | 1L << ((byte)connection.fd & 0x3f);
          fdset.fds_bits[0]._0_1_ = (byte)fdset.fds_bits[0] | 1;
          timeout.tv_sec = 1;
          timeout.tv_usec = 0;
          iVar2 = select(connection.fd + 1,(fd_set *)&fdset,(fd_set *)0x0,(fd_set *)0x0,
                         (timeval *)&timeout);
          dVar13 = currentPosition();
          dVar14 = currentDuration;
          if (((dVar13 < 0.0) || (currentDuration < 0.0)) || (s_lastPositionFetched < 0.0)) {
            printf("%s",s_currentStatus_abi_cxx11_._M_dataplus._M_p);
          }
          else {
            printf("\r[");
            iVar10 = (int)((dVar13 * 40.0) / dVar14);
            if (0x27 < iVar10) {
              iVar10 = 0x28;
            }
            iVar9 = 0;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            while (bVar1 = iVar9 != 0, iVar9 = iVar9 + -1, bVar1) {
              putchar(0x3d);
            }
            iVar9 = 0x7c;
            if (currentlyPlaying != false) {
              iVar9 = 0x3e;
            }
            putchar(iVar9);
            for (iVar10 = iVar10 + -0x28; iVar10 != 0; iVar10 = iVar10 + 1) {
              putchar(0x2d);
            }
            printf("] ");
            printTimestamp((int)dVar13);
            putchar(0x2f);
            printTimestamp((int)dVar14);
            pSVar8 = currentSegments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pSVar12 = currentSegments.super__Vector_base<Segment,_std::allocator<Segment>_>.
                           _M_impl.super__Vector_impl_data._M_start; pSVar12 != pSVar8;
                pSVar12 = pSVar12 + 1) {
              iVar10 = (int)((pSVar12->begin * 40.0) / dVar14);
              if (0x26 < iVar10) {
                iVar10 = 0x27;
              }
              printf("\r\x1b[C");
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              while (bVar1 = iVar10 != 0, iVar10 = iVar10 + -1, bVar1) {
                printf("\x1b[C");
              }
              iVar10 = (int)(((pSVar12->end - pSVar12->begin) * 40.0) / dVar14);
              if (iVar10 < 2) {
                iVar10 = 1;
              }
              while (bVar1 = iVar10 != 0, iVar10 = iVar10 + -1, bVar1) {
                putchar(0x23);
              }
            }
          }
          fflush(_stdout);
          printf("\x1b[2K\r");
          if (iVar2 < 0) {
            perror("select()");
            goto LAB_00108902;
          }
          piVar5 = __errno_location();
          __lhs = &message._namespace;
        } while (*piVar5 == 4);
        if (((byte)fdset.fds_bits[0] & 1) == 0) {
LAB_00107c41:
          dVar14 = nextSegmentStart;
          if (iVar2 == 0) {
            if ((0.0 < nextSegmentStart) && (tVar6 = time((time_t *)0x0), dVar14 <= (double)tVar6))
            {
              nextSegmentStart = -1.0;
              cc::sendSimple(&connection,GetStatus,Media);
            }
            tVar6 = time((time_t *)0x0);
            if (0x1e < tVar6 - s_lastPing) {
              if (s_verbose == true) {
                poVar7 = std::operator<<((ostream *)&std::cout,"Sending ping, last ping: ");
                poVar7 = std::ostream::_M_insert<long>((long)poVar7);
                poVar7 = std::operator<<(poVar7," current time: ");
                poVar7 = std::ostream::_M_insert<long>((long)poVar7);
                poVar7 = std::operator<<(poVar7," delta: ");
                poVar7 = std::ostream::_M_insert<long>((long)poVar7);
                std::endl<char,std::char_traits<char>>(poVar7);
              }
              bVar1 = cc::sendSimple(&connection,Ping,Heartbeat);
              if (!bVar1) {
                puts("Failed to send ping, assuming disconnected");
                iVar2 = 0x6e;
                goto LAB_00108909;
              }
              s_lastPing = time((time_t *)0x0);
            }
          }
          __nbytes = 0x40;
          if (((ulong)fdset.fds_bits[connection.fd / 0x40] >> ((long)connection.fd % 0x40 & 0x3fU) &
              1) != 0) {
            iVar2 = (int)&connection;
            Connection::read_abi_cxx11_((Connection *)&msgLengthBuffer,iVar2,(void *)0x4,0x40);
            if (msgLengthBuffer._M_string_length == 4) {
              if (connection.eof == true) {
                puts("Connection closed");
                iVar2 = 0x68;
              }
              else {
                uVar3 = *(uint *)msgLengthBuffer._M_dataplus._M_p;
                uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18;
                if (0x10000 < uVar3) {
                  printf("Message length out of range: %d\n",(ulong)uVar3);
                  goto LAB_00108987;
                }
                Connection::read_abi_cxx11_
                          ((Connection *)&response,iVar2,(void *)(ulong)uVar3,__nbytes);
                if (response._M_string_length < uVar3) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"Short read, expected ");
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                  poVar7 = std::operator<<(poVar7," got ");
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  iVar2 = 0x4a;
                }
                else {
                  message._8_4_ = 0;
                  message._protocol_version = 0;
                  message._0_8_ = &PTR__CastMessage_00127a30;
                  message._source_id._M_dataplus._M_p = (pointer)&message._source_id.field_2;
                  message._source_id._M_string_length = 0;
                  message._source_id.field_2._M_local_buf[0] = '\0';
                  message._destination_id._M_dataplus._M_p =
                       (pointer)&message._destination_id.field_2;
                  message._destination_id._M_string_length = 0;
                  message._destination_id.field_2._M_local_buf[0] = '\0';
                  message._namespace._M_dataplus._M_p = (pointer)&message._namespace.field_2;
                  message._namespace._M_string_length = 0;
                  message._namespace.field_2._M_local_buf[0] = '\0';
                  message._payload_type = 0;
                  message._payload_utf8._M_dataplus._M_p = (pointer)&message._payload_utf8.field_2;
                  message._payload_utf8._M_string_length = 0;
                  message._payload_utf8.field_2._M_local_buf[0] = '\0';
                  message._payload_binary._M_dataplus._M_p =
                       (pointer)&message._payload_binary.field_2;
                  message._payload_binary._M_string_length = 0;
                  message._payload_binary.field_2._M_local_buf[0] = '\0';
                  bVar1 = ec::
                          cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                          ::parse((cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                                   *)&message,response._M_dataplus._M_p,response._M_string_length);
                  if (bVar1) {
                    std::__cxx11::string::string
                              ((string *)&payload,(string *)&message._payload_utf8);
                    if (payload._M_string_length == 0) {
                      puts("No string payload");
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&state,"\"type\"\\s*:\\s*\"([^\"]+)\"",
                                 (allocator<char> *)&mediaSession);
                      regexExtract(&type,&state,&payload);
                      std::__cxx11::string::~string((string *)&state);
                      bVar1 = std::operator!=(&type,"PING");
                      if ((bVar1) && (s_verbose == true)) {
                        poVar7 = std::operator<<((ostream *)&std::cout,(string *)&message._source_id
                                                );
                        poVar7 = std::operator<<(poVar7," > ");
                        poVar7 = std::operator<<(poVar7,(string *)&message._destination_id);
                        poVar7 = std::operator<<(poVar7," (");
                        poVar7 = std::operator<<(poVar7,(string *)__lhs);
                        poVar7 = std::operator<<(poVar7,"): \n");
                        poVar7 = std::operator<<(poVar7,(string *)&payload);
                        std::endl<char,std::char_traits<char>>(poVar7);
                      }
                      bVar1 = std::operator==(&type,"CLOSE");
                      if (bVar1) {
                        urn = Connect;
                        std::__cxx11::string::assign((char *)&s_currentStatus_abi_cxx11_);
LAB_00107fc6:
                        cc::sendSimple(&connection,urn,urn);
                      }
                      else {
                        bVar1 = std::operator==(&type,"INVALID_REQUEST");
                        if (bVar1) {
                          std::__cxx11::string::assign((char *)&s_currentStatus_abi_cxx11_);
                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                   (string *)&message._source_id);
                          poVar7 = std::operator<<(poVar7," > ");
                          poVar7 = std::operator<<(poVar7,(string *)&message._destination_id);
                          poVar7 = std::operator<<(poVar7," (");
                          poVar7 = std::operator<<(poVar7,(string *)__lhs);
                          poVar7 = std::operator<<(poVar7,"): \n");
                          poVar7 = std::operator<<(poVar7,(string *)&payload);
                          std::endl<char,std::char_traits<char>>(poVar7);
                          std::__cxx11::string::~string((string *)&type);
                          std::__cxx11::string::~string((string *)&payload);
                          goto LAB_00108ab5;
                        }
                        bVar1 = std::operator==(&type,"MEDIA_STATUS");
                        if (bVar1) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&state,"\"duration\"\\s*:\\s*([0-9.]+)",
                                     (allocator<char> *)&mediaSession);
                          extractNumber(&state,&payload,&currentDuration);
                          std::__cxx11::string::~string((string *)&state);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&state,"\"currentTime\"\\s*:\\s*([0-9.]+)",
                                     (allocator<char> *)&mediaSession);
                          bVar1 = extractNumber(&state,&payload,&s_currentPosition);
                          std::__cxx11::string::~string((string *)&state);
                          if (bVar1) {
                            tVar6 = time((time_t *)0x0);
                            s_lastPositionFetched = (double)tVar6;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&mediaSession,"\"playerState\"\\s*:\\s*\"([A-Z]+)\"",
                                     (allocator<char> *)&videoID);
                          regexExtract(&state,&mediaSession,&payload);
                          std::__cxx11::string::~string((string *)&mediaSession);
                          if (state._M_string_length != 0) {
                            currentlyPlaying = std::operator==(&state,"PLAYING");
                            std::__cxx11::string::_M_assign((string *)&s_currentStatus_abi_cxx11_);
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&videoID,"\"mediaSessionId\"\\s*:\\s*([0-9]+)",
                                     (allocator<char> *)&customState);
                          regexExtract(&mediaSession,&videoID,&payload);
                          std::__cxx11::string::~string((string *)&videoID);
                          if (mediaSession._M_string_length != 0) {
                            if (s_verbose == true) {
                              poVar7 = std::operator<<((ostream *)&std::cout,"Got media session ");
                              poVar7 = std::operator<<(poVar7,(string *)&mediaSession);
                              std::endl<char,std::char_traits<char>>(poVar7);
                            }
                            std::__cxx11::string::_M_assign((string *)cc::mediaSession_abi_cxx11_);
                          }
                          if (s_youtube == '\x01') {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&customState,
                                       "\"contentId\"\\s*:\\s*\"([A-Za-z0-9_-]+)\"",
                                       (allocator<char> *)&local_d0);
                            regexExtract(&videoID,&customState,&payload);
                            std::__cxx11::string::~string((string *)&customState);
                            if (s_verbose == true) {
                              poVar7 = std::operator<<((ostream *)&std::cout,"Video id: \'");
                              poVar7 = std::operator<<(poVar7,(string *)&videoID);
                              poVar7 = std::operator<<(poVar7,"\'");
                              std::endl<char,std::char_traits<char>>(poVar7);
                            }
                            if ((videoID._M_string_length != 0) &&
                               (bVar1 = std::operator!=(&videoID,&currentVideo_abi_cxx11_), bVar1))
                            {
                              downloadSegments((vector<Segment,_std::allocator<Segment>_> *)
                                               &customState,&videoID);
                              std::vector<Segment,_std::allocator<Segment>_>::_M_move_assign
                                        (&currentSegments,&customState);
                              std::_Vector_base<Segment,_std::allocator<Segment>_>::~_Vector_base
                                        ((_Vector_base<Segment,_std::allocator<Segment>_> *)
                                         &customState);
                              std::__cxx11::string::_M_assign((string *)&currentVideo_abi_cxx11_);
                              nextSegmentStart = -1.0;
                            }
                            if (currentSegments.
                                super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                super__Vector_impl_data._M_start !=
                                currentSegments.
                                super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                super__Vector_impl_data._M_finish) {
                              dVar14 = currentPosition();
                              if (0.0 <= dVar14) {
                                local_2d8 = -1.0;
                                if (currentSegments.
                                    super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                    super__Vector_impl_data._M_start !=
                                    currentSegments.
                                    super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                    super__Vector_impl_data._M_finish) {
                                  bVar1 = false;
                                  local_2d8 = 1.79769313486232e+308;
                                  for (pSVar8 = currentSegments.
                                                super__Vector_base<Segment,_std::allocator<Segment>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                                      pSVar8 != currentSegments.
                                                super__Vector_base<Segment,_std::allocator<Segment>_>
                                                ._M_impl.super__Vector_impl_data._M_finish;
                                      pSVar8 = pSVar8 + 1) {
                                    if ((dVar14 < pSVar8->end || dVar14 == pSVar8->end) &&
                                       (!(bool)(bVar1 & local_2d8 <= pSVar8->begin))) {
                                      bVar1 = true;
                                      local_2d8 = pSVar8->begin;
                                    }
                                  }
                                  if (!bVar1) goto LAB_001084e3;
                                  local_2d8 = local_2d8 - dVar14;
                                }
                              }
                              else {
                                puts("no current position");
LAB_001084e3:
                                local_2d8 = -1.0;
                              }
                              if (s_verbose == true) {
                                std::operator<<((ostream *)&std::cout,"time to next segment: ");
                                poVar7 = std::ostream::_M_insert<double>(local_2d8);
                                std::endl<char,std::char_traits<char>>(poVar7);
                              }
                              if (0.0 <= local_2d8) {
                                tVar6 = time((time_t *)0x0);
                                nextSegmentStart = local_2d8 + (double)tVar6;
                              }
                              if ((currentVideo_abi_cxx11_._M_string_length != 0) &&
                                 (currentSegments.
                                  super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                  super__Vector_impl_data._M_start !=
                                  currentSegments.
                                  super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                  super__Vector_impl_data._M_finish)) {
                                dVar14 = currentPosition();
                                dVar14 = ceil(dVar14);
                                iVar2 = (int)dVar14;
                                if ((-1 < iVar2) &&
                                   (currentSegments.
                                    super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                    super__Vector_impl_data._M_start !=
                                    currentSegments.
                                    super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                    super__Vector_impl_data._M_finish)) {
                                  for (pSVar8 = currentSegments.
                                                super__Vector_base<Segment,_std::allocator<Segment>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                                      pSVar8 != currentSegments.
                                                super__Vector_base<Segment,_std::allocator<Segment>_>
                                                ._M_impl.super__Vector_impl_data._M_finish;
                                      pSVar8 = pSVar8 + 1) {
                                    dVar14 = pSVar8->end;
                                    if ((iVar2 < (int)dVar14) &&
                                       (pSVar8->begin <= (double)iVar2 &&
                                        (double)iVar2 != pSVar8->begin)) {
                                      if (0.0 <= dVar14) {
                                        if (s_verbose == true) {
                                          currentPosition();
                                          printf("Current segment ends at: %f, position at %f\n",
                                                 dVar14);
                                        }
                                        if ((currentlyPlaying == true) &&
                                           (tVar6 = time((time_t *)0x0), s_lastSeek < tVar6)) {
                                          s_lastSeek = time((time_t *)0x0);
                                          puts("Skipping sponsor...");
                                          s_currentPosition = -1.0;
                                          nextSegmentStart = -1.0;
                                          s_lastPositionFetched = -1.0;
                                          cc::seek(&connection,dVar14);
                                        }
                                      }
                                      break;
                                    }
                                  }
                                }
                              }
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_d0,"\"playerState\"\\s*:\\s*(-?[0-9]+)",
                                       &local_2c9);
                            regexExtract(&customState,&local_d0,&payload);
                            std::__cxx11::string::~string((string *)&local_d0);
                            if (s_verbose == true) {
                              poVar7 = std::operator<<((ostream *)&std::cout,"Custom player state: "
                                                      );
                              poVar7 = std::operator<<(poVar7,(string *)&customState);
                              std::endl<char,std::char_traits<char>>(poVar7);
                            }
                            if ((s_adblock == '\x01') &&
                               (bVar1 = std::operator==(&customState,"1081"), bVar1)) {
                              poVar7 = std::operator<<((ostream *)&std::cout,
                                                       " Playing an ad, attempting to skip");
                              std::endl<char,std::char_traits<char>>(poVar7);
                              dVar13 = currentPosition();
                              dVar14 = 0.0;
                              if (0.0 <= dVar13) {
                                dVar14 = dVar13;
                              }
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_d0,"STOP",&local_2c9);
                              cc::sendSimpleMedia(&connection,&local_d0);
                              std::__cxx11::string::~string((string *)&local_d0);
                              cc::loadMedia(&connection,&currentVideo_abi_cxx11_,dVar14 + 1.0);
                            }
                            std::__cxx11::string::~string((string *)&customState);
                            std::__cxx11::string::~string((string *)&videoID);
                          }
LAB_00108847:
                          std::__cxx11::string::~string((string *)&mediaSession);
                          std::__cxx11::string::~string((string *)&state);
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"urn:x-cast:com.google.cast.tp.heartbeat");
                          if (bVar1) {
                            bVar1 = std::operator==(&type,"PING");
                            urn = Pong;
                            if (bVar1) goto LAB_00107fc6;
                          }
                          else {
                            bVar1 = std::operator==(__lhs,"urn:x-cast:com.google.cast.receiver");
                            if (bVar1) {
                              bVar1 = std::operator==(&type,"RECEIVER_STATUS");
                              if (bVar1) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&mediaSession,
                                           "\"displayName\"\\s*:\\s*\"([^\"]+)\"",
                                           (allocator<char> *)&videoID);
                                regexExtract(&state,&mediaSession,&payload);
                                std::__cxx11::string::~string((string *)&mediaSession);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&videoID,"\"sessionId\"\\s*:\\s*\"([^\"]+)\"",
                                           (allocator<char> *)&customState);
                                regexExtract(&mediaSession,&videoID,&payload);
                                std::__cxx11::string::~string((string *)&videoID);
                                if (s_verbose == true) {
                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                           "app display name: ");
                                  poVar7 = std::operator<<(poVar7,(string *)&state);
                                  std::endl<char,std::char_traits<char>>(poVar7);
                                  poVar7 = std::operator<<((ostream *)&std::cout,"session: ");
                                  poVar7 = std::operator<<(poVar7,(string *)&mediaSession);
                                  std::endl<char,std::char_traits<char>>(poVar7);
                                }
                                if (mediaSession._M_string_length != 0) {
                                  std::__cxx11::string::_M_assign((string *)cc::dest_abi_cxx11_);
                                }
                                bVar1 = std::operator==(&state,"YouTube");
                                if (bVar1) {
                                  s_youtube = '\x01';
                                  if (s_verbose == true) {
                                    puts("Youtube playing");
                                  }
                                }
                                else if (state._M_string_length != 0) {
                                  s_youtube = '\0';
                                  std::operator+(&customState,"Not youtube: \'",&state);
                                  std::operator+(&videoID,&customState,"\'");
                                  std::__cxx11::string::operator=
                                            ((string *)&s_currentStatus_abi_cxx11_,
                                             (string *)&videoID);
                                  std::__cxx11::string::~string((string *)&videoID);
                                  std::__cxx11::string::~string((string *)&customState);
                                }
                                lVar4 = std::__cxx11::string::find((char *)&payload,0x119ed5);
                                if (lVar4 != -1) {
                                  if (s_verbose == true) {
                                    puts("Sending get status for media");
                                  }
                                  cc::sendSimple(&connection,Connect,Connection);
                                  cc::sendSimple(&connection,GetStatus,Media);
                                }
                                goto LAB_00108847;
                              }
                            }
                            else {
                              bVar1 = std::operator!=(&type,"mdxSessionStatus");
                              if (bVar1) {
                                poVar7 = std::operator<<((ostream *)&std::cerr,
                                                         "Unhandled message type: ");
                                poVar7 = std::operator<<(poVar7,(string *)&type);
                                std::endl<char,std::char_traits<char>>(poVar7);
                              }
                            }
                          }
                        }
                      }
                      std::__cxx11::string::~string((string *)&type);
                    }
                    std::__cxx11::string::~string((string *)&payload);
                    CastMessage::~CastMessage(&message);
                    if (connection.eof == false) {
                      s_lastPing = time((time_t *)0x0);
                      std::__cxx11::string::~string((string *)&response);
                      std::__cxx11::string::~string((string *)&msgLengthBuffer);
                      goto LAB_001078f3;
                    }
                    pcVar11 = "Disconnected";
                  }
                  else {
                    puts("Parsing message from chromecast failed");
LAB_00108ab5:
                    CastMessage::~CastMessage(&message);
                    pcVar11 = "Failed to parse message";
                  }
                  puts(pcVar11);
                  iVar2 = 0x68;
                }
                std::__cxx11::string::~string((string *)&response);
              }
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to read message size: \'");
              poVar7 = std::operator<<(poVar7,(string *)&msgLengthBuffer);
              poVar7 = std::operator<<(poVar7,"\'");
              std::endl<char,std::char_traits<char>>(poVar7);
LAB_00108987:
              iVar2 = 0x4a;
            }
            std::__cxx11::string::~string((string *)&msgLengthBuffer);
            goto LAB_00108909;
          }
          goto LAB_001078f3;
        }
        uVar3 = getchar();
        if (uVar3 == 0x20) {
          bVar1 = std::operator==(&s_currentStatus_abi_cxx11_,"PLAYING");
          if (bVar1) {
            puts("Pausing");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&message,"PAUSE",(allocator<char> *)&payload);
            cc::sendSimpleMedia(&connection,(string *)&message);
          }
          else {
            bVar1 = std::operator==(&s_currentStatus_abi_cxx11_,"PAUSED");
            if (!bVar1) goto LAB_00107c41;
            puts("Resuming playback");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&message,"PLAY",(allocator<char> *)&payload);
            cc::sendSimpleMedia(&connection,(string *)&message);
          }
          std::__cxx11::string::~string((string *)&message);
          goto LAB_00107c41;
        }
        if ((uVar3 != 0x1b) && (uVar3 != 0x71)) {
          if (s_verbose == true) {
            printf("Unhandled key 0x%x\n",(ulong)uVar3);
          }
          goto LAB_00107c41;
        }
        s_running = '\x01';
LAB_001089ff:
        iVar2 = 0;
        goto LAB_00108909;
      }
      pcVar11 = "Failed to send getstatus message";
    }
    else {
      pcVar11 = "Failed to send connect message";
    }
    puts(pcVar11);
  }
LAB_00108902:
  piVar5 = __errno_location();
  iVar2 = *piVar5;
LAB_00108909:
  Connection::~Connection(&connection);
  return iVar2;
}

Assistant:

int loop(const sockaddr_in &address)
{
    cc::dest = "";

    if (s_verbose) {
        puts("Opening connection");
    }
    Connection connection;
    if (!connection.connect(address)) {
        std::cerr << "Failed to connect to " << inet_ntoa(address.sin_addr) << std::endl;
        return errno;
    }
    if (s_verbose) {
        puts("Sending connection message");
    }
    if (!cc::sendSimple(connection, cc::msg::Connect, cc::ns::Connection)) {
        puts("Failed to send connect message");
        return errno;
    }
    puts("Connected");
    if (!cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Receiver)) {
        puts("Failed to send getstatus message");
        return errno;
    }
    s_lastPing = time(nullptr);

    while (s_running && !connection.eof) {
        fd_set fdset;
        FD_ZERO(&fdset);
        FD_SET(connection.fd, &fdset);
        FD_SET(STDIN_FILENO, &fdset);

        timeval timeout;
        timeout.tv_sec = 1; // max 1 second so we can update the progress bar
        timeout.tv_usec = 0;
        const int events = select(connection.fd + 1, &fdset, 0, 0, &timeout);
        printProgress(currentPosition(), currentDuration);

        if (events < 0) {
            perror("select()");
            return errno;
        }
        if (errno == EINTR) {
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fdset)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                s_running = false;
                return 0;
            case ' ':
                if (s_currentStatus == "PLAYING") {
                    puts("Pausing");
                    cc::sendSimpleMedia(connection, "PAUSE");
                } else if (s_currentStatus == "PAUSED") {
                    puts("Resuming playback");
                    cc::sendSimpleMedia(connection, "PLAY");
                }
                break;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }

        if (events == 0) { // timeout
            if (nextSegmentStart > 0 && nextSegmentStart <= time(nullptr)) {
                nextSegmentStart = -1;
                // Update to make sure we are in sync before we skip the sponsor
                cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Media);
            }

            const time_t currentTime = time(nullptr);
            if (currentTime - s_lastPing > PING_INTERVAL) {
                if (s_verbose) {
                    std::cout << "Sending ping, last ping: " << s_lastPing << " current time: " << currentTime << " delta: " << (currentTime - s_lastPing) << std::endl;
                }
                if (!cc::sendSimple(connection, cc::msg::Ping, cc::ns::Heartbeat)) {
                    puts("Failed to send ping, assuming disconnected");
                    return ETIMEDOUT;
                }
                s_lastPing = time(nullptr);
            }
        }

        if (!FD_ISSET(connection.fd, &fdset)) {
            continue;
        }

        std::string msgLengthBuffer = connection.read(sizeof(uint32_t));
        if (msgLengthBuffer.size() != 4) {
            std::cerr << "Failed to read message size: '" << msgLengthBuffer << "'" << std::endl;
            return EBADMSG;
        }
        if (connection.eof) {
            puts("Connection closed");
            return ECONNRESET;
        }
        uint32_t msgLength = 0;
        memcpy(&msgLength, msgLengthBuffer.data(), sizeof msgLength);
        msgLength = ntohl(msgLength);
        if (msgLength > 64 * 1024) { // 64kb max according to the spec
            printf("Message length out of range: %d\n", msgLength);
            return EBADMSG;
        }

        std::string response = connection.read(msgLength);
        if (response.size() < msgLength) {
            std::cerr << "Short read, expected " << msgLength << " got " << response.size() << std::endl;
            return EBADMSG;
        }
        if (!handleMessage(&connection, response)) {
            puts("Failed to parse message");
            return ECONNRESET;
        }
        if (connection.eof) {
            puts("Disconnected");
            return ECONNRESET;
        }

        // We got a valid message
        s_lastPing = time(nullptr);
    }
    return 0;
}